

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmSourceFileSetName(void *arg,char *name,char *dir,int numSourceExtensions,
                        char **sourceExtensions,int numHeaderExtensions,char **headerExtensions)

{
  string *this;
  pointer pbVar1;
  long lVar2;
  ostream *poVar3;
  string *ext;
  ulong uVar4;
  pointer pbVar5;
  pointer pbVar6;
  bool bVar7;
  undefined1 local_278 [48];
  string hname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headerExts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceExts;
  string pathname;
  string local_1c8;
  ostringstream e;
  
  if (*arg == 0) {
    sourceExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sourceExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sourceExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    headerExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    headerExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    headerExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar4 = 0;
    if (0 < numSourceExtensions) {
      uVar4 = (ulong)(uint)numSourceExtensions;
    }
    while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sourceExts,
                 sourceExtensions);
      sourceExtensions = sourceExtensions + 1;
    }
    uVar4 = 0;
    if (0 < numHeaderExtensions) {
      uVar4 = (ulong)(uint)numHeaderExtensions;
    }
    while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&headerExts,
                 headerExtensions);
      headerExtensions = headerExtensions + 1;
    }
    this = (string *)((long)arg + 8);
    std::__cxx11::string::assign((char *)this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,name,(allocator<char> *)local_278);
    cmsys::SystemTools::CollapseFullPath(&pathname,(string *)&e,dir);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::string((string *)&hname,(string *)&pathname);
    bVar7 = cmsys::SystemTools::FileExists(&hname);
    pbVar6 = sourceExts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar7) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,name,(allocator<char> *)&local_1c8);
      cmsys::SystemTools::GetFilenamePath((string *)&e,(string *)local_278);
      std::__cxx11::string::operator=(this,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)local_278);
      if (*(long *)((long)arg + 0x10) != 0) {
        std::__cxx11::string::append((char *)this);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,name,(allocator<char> *)&local_1c8);
      cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&e,(string *)local_278);
      std::__cxx11::string::append(this);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)local_278);
      lVar2 = std::__cxx11::string::rfind((char)&hname,0x2e);
      if (lVar2 != -1) {
        std::__cxx11::string::substr((ulong)&e,(ulong)&hname);
        std::__cxx11::string::operator=((string *)((long)arg + 0x28),(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        bVar7 = cmsys::SystemTools::FileIsFullPath(name);
        if (bVar7) {
          lVar2 = std::__cxx11::string::rfind((char)&hname,0x2f);
          if (lVar2 != -1) {
            std::__cxx11::string::substr((ulong)&e,(ulong)&hname);
            std::__cxx11::string::operator=(this,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
          }
        }
      }
      std::__cxx11::string::_M_assign((string *)((long)arg + 0x48));
    }
    else {
      for (pbVar5 = sourceExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = headerExts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pbVar5 != pbVar6; pbVar5 = pbVar5 + 1
          ) {
        _e = (pointer)pathname._M_string_length;
        local_278._0_8_ = &DAT_00000001;
        local_278._8_8_ = local_278 + 0x10;
        local_278[0x10] = '.';
        cmStrCat<std::__cxx11::string>(&local_1c8,(cmAlphaNum *)&e,(cmAlphaNum *)local_278,pbVar5);
        std::__cxx11::string::operator=((string *)&hname,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        bVar7 = cmsys::SystemTools::FileExists(&hname);
        if (bVar7) {
          std::__cxx11::string::_M_assign((string *)((long)arg + 0x28));
          std::__cxx11::string::_M_assign((string *)((long)arg + 0x48));
          goto LAB_0031a6c2;
        }
      }
      for (pbVar6 = headerExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1
          ) {
        _e = (pointer)pathname._M_string_length;
        local_278._0_8_ = &DAT_00000001;
        local_278._8_8_ = local_278 + 0x10;
        local_278[0x10] = '.';
        cmStrCat<std::__cxx11::string>(&local_1c8,(cmAlphaNum *)&e,(cmAlphaNum *)local_278,pbVar6);
        std::__cxx11::string::operator=((string *)&hname,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        bVar7 = cmsys::SystemTools::FileExists(&hname);
        if (bVar7) {
          std::__cxx11::string::_M_assign((string *)((long)arg + 0x28));
          std::__cxx11::string::_M_assign((string *)((long)arg + 0x48));
          goto LAB_0031a6c2;
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,"Cannot find source file \"");
      poVar3 = std::operator<<(poVar3,(string *)&pathname);
      std::operator<<(poVar3,"\"");
      std::operator<<((ostream *)&e,"\n\nTried extensions");
      pbVar6 = sourceExts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = sourceExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = headerExts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pbVar5 != pbVar6; pbVar5 = pbVar5 + 1
          ) {
        poVar3 = std::operator<<((ostream *)&e," .");
        std::operator<<(poVar3,(string *)pbVar5);
      }
      for (pbVar6 = headerExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1
          ) {
        poVar3 = std::operator<<((ostream *)&e," .");
        std::operator<<(poVar3,(string *)pbVar6);
      }
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error((string *)local_278);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
LAB_0031a6c2:
    std::__cxx11::string::~string((string *)&hname);
    std::__cxx11::string::~string((string *)&pathname);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&headerExts);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sourceExts);
  }
  return;
}

Assistant:

static void CCONV cmSourceFileSetName(void* arg, const char* name,
                                      const char* dir, int numSourceExtensions,
                                      const char** sourceExtensions,
                                      int numHeaderExtensions,
                                      const char** headerExtensions)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (sf->RealSourceFile) {
    // SetName is allowed only on temporary source files created by
    // the command for building and passing to AddSource.
    return;
  }
  std::vector<std::string> sourceExts;
  std::vector<std::string> headerExts;
  int i;
  for (i = 0; i < numSourceExtensions; ++i) {
    sourceExts.emplace_back(sourceExtensions[i]);
  }
  for (i = 0; i < numHeaderExtensions; ++i) {
    headerExts.emplace_back(headerExtensions[i]);
  }

  // Save the original name given.
  sf->SourceName = name;

  // Convert the name to a full path in case the given name is a
  // relative path.
  std::string pathname = cmSystemTools::CollapseFullPath(name, dir);

  // First try and see whether the listed file can be found
  // as is without extensions added on.
  std::string hname = pathname;
  if (cmSystemTools::FileExists(hname)) {
    sf->SourceName = cmSystemTools::GetFilenamePath(name);
    if (!sf->SourceName.empty()) {
      sf->SourceName += "/";
    }
    sf->SourceName += cmSystemTools::GetFilenameWithoutLastExtension(name);
    std::string::size_type pos = hname.rfind('.');
    if (pos != std::string::npos) {
      sf->SourceExtension = hname.substr(pos + 1, hname.size() - pos);
      if (cmSystemTools::FileIsFullPath(name)) {
        std::string::size_type pos2 = hname.rfind('/');
        if (pos2 != std::string::npos) {
          sf->SourceName = hname.substr(pos2 + 1, pos - pos2 - 1);
        }
      }
    }

    sf->FullPath = hname;
    return;
  }

  // Next, try the various source extensions
  for (std::string const& ext : sourceExts) {
    hname = cmStrCat(pathname, '.', ext);
    if (cmSystemTools::FileExists(hname)) {
      sf->SourceExtension = ext;
      sf->FullPath = hname;
      return;
    }
  }

  // Finally, try the various header extensions
  for (std::string const& ext : headerExts) {
    hname = cmStrCat(pathname, '.', ext);
    if (cmSystemTools::FileExists(hname)) {
      sf->SourceExtension = ext;
      sf->FullPath = hname;
      return;
    }
  }

  std::ostringstream e;
  e << "Cannot find source file \"" << pathname << "\"";
  e << "\n\nTried extensions";
  for (std::string const& ext : sourceExts) {
    e << " ." << ext;
  }
  for (std::string const& ext : headerExts) {
    e << " ." << ext;
  }
  cmSystemTools::Error(e.str());
}